

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void icu_63::double_conversion::InitialScaledStartValuesPositiveExponent
               (uint64_t significand,int exponent,int estimated_power,bool need_boundary_deltas,
               Bignum *numerator,Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus)

{
  Bignum *denominator_local;
  Bignum *numerator_local;
  bool need_boundary_deltas_local;
  int estimated_power_local;
  int exponent_local;
  uint64_t significand_local;
  
  Bignum::AssignUInt64(numerator,significand);
  Bignum::ShiftLeft(numerator,exponent);
  Bignum::AssignPowerUInt16(denominator,10,estimated_power);
  if (need_boundary_deltas) {
    Bignum::ShiftLeft(denominator,1);
    Bignum::ShiftLeft(numerator,1);
    Bignum::AssignUInt16(delta_plus,1);
    Bignum::ShiftLeft(delta_plus,exponent);
    Bignum::AssignUInt16(delta_minus,1);
    Bignum::ShiftLeft(delta_minus,exponent);
  }
  return;
}

Assistant:

static void InitialScaledStartValuesPositiveExponent(
    uint64_t significand, int exponent,
    int estimated_power, bool need_boundary_deltas,
    Bignum* numerator, Bignum* denominator,
    Bignum* delta_minus, Bignum* delta_plus) {
  // A positive exponent implies a positive power.
  ASSERT(estimated_power >= 0);
  // Since the estimated_power is positive we simply multiply the denominator
  // by 10^estimated_power.

  // numerator = v.
  numerator->AssignUInt64(significand);
  numerator->ShiftLeft(exponent);
  // denominator = 10^estimated_power.
  denominator->AssignPowerUInt16(10, estimated_power);

  if (need_boundary_deltas) {
    // Introduce a common denominator so that the deltas to the boundaries are
    // integers.
    denominator->ShiftLeft(1);
    numerator->ShiftLeft(1);
    // Let v = f * 2^e, then m+ - v = 1/2 * 2^e; With the common
    // denominator (of 2) delta_plus equals 2^e.
    delta_plus->AssignUInt16(1);
    delta_plus->ShiftLeft(exponent);
    // Same for delta_minus. The adjustments if f == 2^p-1 are done later.
    delta_minus->AssignUInt16(1);
    delta_minus->ShiftLeft(exponent);
  }
}